

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::ProbeStack
          (ThreadContext *this,size_t size,ScriptContext *scriptContext,PVOID returnAddress)

{
  bool bVar1;
  PVOID returnAddress_local;
  ScriptContext *scriptContext_local;
  size_t size_local;
  ThreadContext *this_local;
  
  ProbeStackNoDispose(this,size,scriptContext,returnAddress);
  if ((this->callDispose & 1U) != 0) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,DisposePhase);
    if (bVar1) {
      bVar1 = Memory::Recycler::NeedDispose(this->recycler);
      Output::Print(L"[Dispose] NeedDispose in ProbeStack: %d\n",(ulong)bVar1);
      Output::Flush();
    }
    Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32772>(this->recycler);
  }
  return;
}

Assistant:

void
ThreadContext::ProbeStack(size_t size, Js::ScriptContext *scriptContext, PVOID returnAddress)
{
    this->ProbeStackNoDispose(size, scriptContext, returnAddress);

#if PERFMAP_TRACE_ENABLED
    if (PlatformAgnostic::PerfTrace::mapsRequested)
    {
        PlatformAgnostic::PerfTrace::WritePerfMap();
    }
#endif

    // BACKGROUND-GC TODO: If we're stuck purely in JITted code, we should have the
    // background GC thread modify the threads stack limit to trigger the runtime stack probe
    if (this->callDispose)
    {
        PHASE_PRINT_TRACE1(Js::DisposePhase, _u("[Dispose] NeedDispose in ProbeStack: %d\n"), this->recycler->NeedDispose());
        this->recycler->FinishDisposeObjectsNow<FinishDisposeTimed>();
    }
}